

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O3

void test_qpixl_frqi_check_matrix<qclab::dense::SquareMatrix<double>,qclab::dense::SquareMatrix<double>,double>
               (SquareMatrix<double> *m1,SquareMatrix<double> *m2,double eps)

{
  ulong uVar1;
  ulong uVar2;
  char *message;
  double unaff_R12;
  double unaff_R13;
  double unaff_R14;
  char in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffa9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  Message local_48;
  double local_40;
  AssertHelper in_stack_ffffffffffffffc8;
  
  local_40 = eps;
  if (m1->size_ == m2->size_) {
    if (m1->size_ != 0) {
      uVar2 = 0;
      do {
        uVar1 = 0;
        do {
          testing::internal::DoubleNearPredFormat
                    ((char *)in_stack_ffffffffffffffb0,
                     (char *)CONCAT71(in_stack_ffffffffffffffa9,in_stack_ffffffffffffffa8),
                     (char *)in_stack_ffffffffffffffc8.data_,unaff_R14,unaff_R13,unaff_R12);
          if (in_stack_ffffffffffffffa8 == '\0') {
            testing::Message::Message(&local_48);
            message = "";
            if (in_stack_ffffffffffffffb0 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              message = (in_stack_ffffffffffffffb0->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffffc8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/circuit.cpp"
                       ,0xe,message);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffffc8,&local_48);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc8)
            ;
            if (local_48.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
                (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                 )0x0) {
              (**(code **)(*(long *)local_48.ss_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl + 8))();
            }
          }
          if (in_stack_ffffffffffffffb0 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&stack0xffffffffffffffb0,in_stack_ffffffffffffffb0);
          }
          uVar1 = uVar1 + 1;
        } while (uVar1 < (ulong)m1->size_);
        uVar2 = uVar2 + 1;
      } while (uVar2 < (ulong)m1->size_);
    }
    return;
  }
  __assert_fail("m1.size() == m2.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/frqi/circuit.cpp"
                ,0xb,
                "void test_qpixl_frqi_check_matrix(const MAT1 &, const MAT2 &, const R) [MAT1 = qclab::dense::SquareMatrix<double>, MAT2 = qclab::dense::SquareMatrix<double>, R = double]"
               );
}

Assistant:

void test_qpixl_frqi_check_matrix( const MAT1& m1, const MAT2& m2, const R eps ) {
  assert( m1.size() == m2.size() ) ;
  for ( size_t i = 0; i < m1.size(); i++ ) {
    for ( size_t j = 0; j < m1.size(); j++ ) {
      EXPECT_NEAR( m1(i,j) , m2(i,j)  , eps );
    }
  }
}